

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O3

void btConvexHullInternal::DMul<btConvexHullInternal::Int128,_unsigned_long>::mul
               (Int128 a,Int128 b,Int128 *resLow,Int128 *resHigh)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t uVar4;
  ulong uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t lo;
  ulong uVar8;
  Int128 IVar9;
  Int128 IVar10;
  Int128 IVar11;
  Int128 IVar12;
  uint64_t lo_1;
  
  IVar9 = Int128::mul(a.low,b.low);
  uVar5 = IVar9.high;
  IVar10 = Int128::mul(a.low,b.high);
  IVar11 = Int128::mul(a.high,b.low);
  IVar12 = Int128::mul(a.high,b.high);
  uVar3 = IVar12.low + IVar10.high;
  uVar8 = IVar11.low + IVar10.low;
  uVar1 = (ulong)CARRY8(IVar11.low,IVar10.low);
  uVar2 = uVar3 + IVar11.high;
  uVar4 = uVar2 + uVar1;
  uVar6 = uVar4 + 1;
  uVar7 = uVar6;
  if (!CARRY8(uVar8,uVar5)) {
    uVar7 = uVar4;
  }
  resLow->low = IVar9.low;
  resLow->high = uVar8 + uVar5;
  resHigh->low = uVar7;
  resHigh->high =
       (ulong)(CARRY8(uVar8,uVar5) && uVar6 == 0) +
       (ulong)CARRY8(IVar12.low,IVar10.high) + IVar12.high +
       (ulong)(CARRY8(uVar3,IVar11.high) || CARRY8(uVar2,uVar1));
  return;
}

Assistant:

static void mul(UWord a, UWord b, UWord& resLow, UWord& resHigh)
				{
					UWord p00 = mul(low(a), low(b));
					UWord p01 = mul(low(a), high(b));
					UWord p10 = mul(high(a), low(b));
					UWord p11 = mul(high(a), high(b));
					UWord p0110 = UWord(low(p01)) + UWord(low(p10));
					p11 += high(p01);
					p11 += high(p10);
					p11 += high(p0110);
					shlHalf(p0110);
					p00 += p0110;
					if (p00 < p0110)
					{
						++p11;
					}
					resLow = p00;
					resHigh = p11;
				}